

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

void wasm_module_exports(wasm_module_t *module,wasm_exporttype_vec_t *out)

{
  FILE *__stream;
  ulong uVar1;
  vector<wabt::interp::ExportType,_std::allocator<wabt::interp::ExportType>_> *vec;
  Module *this;
  size_type sVar2;
  wasm_exporttype_t *this_00;
  const_reference other;
  ExportType local_50;
  ulong local_28;
  size_t i;
  vector<wabt::interp::ExportType,_std::allocator<wabt::interp::ExportType>_> *export_types;
  wasm_exporttype_vec_t *out_local;
  wasm_module_t *module_local;
  
  export_types = (vector<wabt::interp::ExportType,_std::allocator<wabt::interp::ExportType>_> *)out;
  out_local = (wasm_exporttype_vec_t *)module;
  this = wasm_ref_t::As<wabt::interp::Module>(&module->super_wasm_ref_t);
  i = (size_t)wabt::interp::Module::export_types(this);
  __stream = _stderr;
  sVar2 = std::vector<wabt::interp::ExportType,_std::allocator<wabt::interp::ExportType>_>::size
                    ((vector<wabt::interp::ExportType,_std::allocator<wabt::interp::ExportType>_> *)
                     i);
  fprintf(__stream,"CAPI: [%s] %zx\n","wasm_module_exports",sVar2);
  vec = export_types;
  sVar2 = std::vector<wabt::interp::ExportType,_std::allocator<wabt::interp::ExportType>_>::size
                    ((vector<wabt::interp::ExportType,_std::allocator<wabt::interp::ExportType>_> *)
                     i);
  wasm_exporttype_vec_new_uninitialized((wasm_exporttype_vec_t *)vec,sVar2);
  local_28 = 0;
  while( true ) {
    uVar1 = local_28;
    sVar2 = std::vector<wabt::interp::ExportType,_std::allocator<wabt::interp::ExportType>_>::size
                      ((vector<wabt::interp::ExportType,_std::allocator<wabt::interp::ExportType>_>
                        *)i);
    if (sVar2 <= uVar1) break;
    this_00 = (wasm_exporttype_t *)operator_new(0x40);
    other = std::vector<wabt::interp::ExportType,_std::allocator<wabt::interp::ExportType>_>::
            operator[]((vector<wabt::interp::ExportType,_std::allocator<wabt::interp::ExportType>_>
                        *)i,local_28);
    wabt::interp::ExportType::ExportType(&local_50,other);
    wasm_exporttype_t::wasm_exporttype_t(this_00,&local_50);
    *(wasm_exporttype_t **)
     (&(((export_types->
         super__Vector_base<wabt::interp::ExportType,_std::allocator<wabt::interp::ExportType>_>).
         _M_impl.super__Vector_impl_data._M_finish)->name)._M_dataplus + local_28 * 8) = this_00;
    wabt::interp::ExportType::~ExportType(&local_50);
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void wasm_module_exports(const wasm_module_t* module,
                         own wasm_exporttype_vec_t* out) {
  auto&& export_types = module->As<Module>()->export_types();
  TRACE("%" PRIzx, export_types.size());
  wasm_exporttype_vec_new_uninitialized(out, export_types.size());

  for (size_t i = 0; i < export_types.size(); ++i) {
    out->data[i] = new wasm_exporttype_t{export_types[i]};
  }
}